

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeEmitter.cpp
# Opt level: O2

bool IsArguments(ParseNode *pnode)

{
  OpCode OVar1;
  code *pcVar2;
  bool bVar3;
  uint uVar4;
  undefined4 *puVar5;
  ParseNodeCall *pPVar6;
  ParseNodeBin *pPVar7;
  ParseNodeTri *pPVar8;
  ParseNodeArrLit *pPVar9;
  ParseNodeUni *pPVar10;
  ParseNodeName *pPVar11;
  uint nop;
  ParseNodePtr pnode_00;
  ParseNodePtr *ppPVar12;
  
  puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
LAB_007558b1:
  OVar1 = pnode->nop;
  nop = (uint)OVar1;
  switch(OVar1) {
  case knopCall:
  case knopNew:
    pPVar6 = ParseNode::AsParseNodeCall(pnode);
    bVar3 = IsArguments(pPVar6->pnodeTarget);
    if (bVar3) {
      return true;
    }
    pPVar6 = ParseNode::AsParseNodeCall(pnode);
    if (pPVar6->pnodeArgs == (ParseNodePtr)0x0) {
      return false;
    }
    pPVar6 = ParseNode::AsParseNodeCall(pnode);
    while (pnode = pPVar6->pnodeArgs, pnode->nop == knopList) {
      pPVar7 = ParseNode::AsParseNodeBin(pnode);
      bVar3 = IsArguments(pPVar7->pnode1);
      if (bVar3) {
        return true;
      }
      pPVar6 = (ParseNodeCall *)ParseNode::AsParseNodeBin(pnode);
    }
    goto LAB_007558b1;
  case knopDot:
  case knopAsg:
  case knopInstOf:
  case knopIn:
  case knopEqv:
  case knopNEqv:
  case knopComma:
  case knopLogOr:
  case knopLogAnd:
  case knopCoalesce:
  case knopLsh:
  case knopRsh:
  case knopRs2:
  case knopIndex:
  case knopAsgAdd:
  case knopAsgSub:
  case knopAsgMul:
  case knopAsgDiv:
  case knopAsgExpo:
  case knopAsgMod:
  case knopAsgAnd:
  case knopAsgXor:
  case knopAsgOr:
  case knopAsgLsh:
  case knopAsgRsh:
  case knopAsgRs2:
  case knopMember:
  case knopMemberShort:
  case knopSetMember:
  case knopGetMember:
  case knopTemp:
  case knopProg:
  case knopModule:
  case knopEndCode:
  case knopDebugger:
  case knopStrTemplate:
  case knopSwitch:
  case knopCase:
  case knopCatch:
  case knopObjectPatternMember:
switchD_007558c7_caseD_30:
    uVar4 = ParseNode::Grfnop(nop);
    if ((uVar4 & 4) == 0) {
      if ((uVar4 & 8) == 0) {
        return false;
      }
      pPVar7 = ParseNode::AsParseNodeBin(pnode);
      pnode_00 = pPVar7->pnode1;
      if ((pnode_00 == (ParseNodePtr)0x0) || (pPVar7->pnode2 == (ParseNodePtr)0x0)) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar5 = 1;
        bVar3 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp"
                           ,0xeb,"(pnodeBin->pnode1 && pnodeBin->pnode2)",
                           "pnodeBin->pnode1 && pnodeBin->pnode2");
        if (!bVar3) goto LAB_00755af5;
        *puVar5 = 0;
        pnode_00 = pPVar7->pnode1;
      }
      bVar3 = IsArguments(pnode_00);
      if (bVar3) {
        return true;
      }
      ppPVar12 = &pPVar7->pnode2;
      break;
    }
    pPVar10 = ParseNode::AsParseNodeUni(pnode);
    pnode = pPVar10->pnode1;
    if (pnode != (ParseNodePtr)0x0) goto LAB_007558b1;
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    *puVar5 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp"
                       ,0xe3,"(pnodeUni->pnode1)","pnodeUni->pnode1");
    if (!bVar3) {
LAB_00755af5:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    ppPVar12 = &pPVar10->pnode1;
    *puVar5 = 0;
    break;
  case knopQmark:
    pPVar8 = ParseNode::AsParseNodeTri(pnode);
    bVar3 = IsArguments(pPVar8->pnode1);
    if (bVar3) {
      return true;
    }
    pPVar8 = ParseNode::AsParseNodeTri(pnode);
    bVar3 = IsArguments(pPVar8->pnode2);
    if (bVar3) {
      return true;
    }
    pPVar8 = ParseNode::AsParseNodeTri(pnode);
    ppPVar12 = &pPVar8->pnode3;
    break;
  case knopList:
  case knopVarDecl:
  case knopConstDecl:
  case knopLetDecl:
  case knopFncDecl:
  case knopClassDecl:
  case knopFor:
  case knopIf:
  case knopWhile:
  case knopDoWhile:
  case knopForIn:
  case knopForOf:
  case knopForAwaitOf:
  case knopBlock:
  case knopWith:
  case knopBreak:
  case knopContinue:
  case knopTryCatch:
  case knopReturn:
  case knopTry:
  case knopThrow:
  case knopFinally:
  case knopTryFinally:
  case knopObjectPattern:
  case knopArrayPattern:
  case knopParamPattern:
    goto switchD_007558c7_caseD_50;
  default:
    if (OVar1 != knopArray) {
      if (OVar1 == knopObject) {
        return true;
      }
      if (nop == 0x16) {
        return true;
      }
      if (nop == 1) {
        pPVar11 = ParseNode::AsParseNodeName(pnode);
        if (pPVar11->sym == (Symbol *)0x0) {
          return false;
        }
        pPVar11 = ParseNode::AsParseNodeName(pnode);
        bVar3 = Symbol::IsArguments(pPVar11->sym);
        return bVar3;
      }
      goto switchD_007558c7_caseD_30;
    }
    pPVar9 = ParseNode::AsParseNodeArrLit(pnode);
    if ((pPVar9->field_0x20 & 4) != 0) {
      return false;
    }
    pPVar9 = ParseNode::AsParseNodeArrLit(pnode);
    if (pPVar9->count == 0) {
      return false;
    }
    pPVar10 = ParseNode::AsParseNodeUni(pnode);
    ppPVar12 = &pPVar10->pnode1;
  }
  pnode = *ppPVar12;
  goto LAB_007558b1;
switchD_007558c7_caseD_50:
  return true;
}

Assistant:

bool IsArguments(ParseNode *pnode)
{
    for (;;)
    {
        switch (pnode->nop)
        {
        case knopName:
            return pnode->AsParseNodeName()->sym && pnode->AsParseNodeName()->sym->IsArguments();

        case knopCall:
        case knopNew:
            if (IsArguments(pnode->AsParseNodeCall()->pnodeTarget))
            {
                return true;
            }

            if (pnode->AsParseNodeCall()->pnodeArgs)
            {
                ParseNode *pnodeArg = pnode->AsParseNodeCall()->pnodeArgs;
                while (pnodeArg->nop == knopList)
                {
                    if (IsArguments(pnodeArg->AsParseNodeBin()->pnode1))
                        return true;

                    pnodeArg = pnodeArg->AsParseNodeBin()->pnode2;
                }

                pnode = pnodeArg;
                break;
            }

            return false;

        case knopArray:
            if (pnode->AsParseNodeArrLit()->arrayOfNumbers || pnode->AsParseNodeArrLit()->count == 0)
            {
                return false;
            }

            pnode = pnode->AsParseNodeUni()->pnode1;
            break;

        case knopQmark:
            if (IsArguments(pnode->AsParseNodeTri()->pnode1) || IsArguments(pnode->AsParseNodeTri()->pnode2))
            {
                return true;
            }

            pnode = pnode->AsParseNodeTri()->pnode3;
            break;

            //
            // Cases where we don't check for "arguments" yet.
            // Assume that they might have it. Disable the optimization in such scenarios
            //
        case knopList:
        case knopObject:
        case knopVarDecl:
        case knopConstDecl:
        case knopLetDecl:
        case knopFncDecl:
        case knopClassDecl:
        case knopFor:
        case knopIf:
        case knopDoWhile:
        case knopWhile:
        case knopForIn:
        case knopForOf:
        case knopForAwaitOf:
        case knopReturn:
        case knopBlock:
        case knopBreak:
        case knopContinue:
        case knopTypeof:
        case knopThrow:
        case knopWith:
        case knopFinally:
        case knopTry:
        case knopTryCatch:
        case knopTryFinally:
        case knopArrayPattern:
        case knopObjectPattern:
        case knopParamPattern:
            return true;

        default:
        {
            uint flags = ParseNode::Grfnop(pnode->nop);
            if (flags&fnopUni)
            {
                ParseNodeUni * pnodeUni = pnode->AsParseNodeUni();
                Assert(pnodeUni->pnode1);

                pnode = pnodeUni->pnode1;
                break;
            }
            else if (flags&fnopBin)
            {
                ParseNodeBin * pnodeBin = pnode->AsParseNodeBin();
                Assert(pnodeBin->pnode1 && pnodeBin->pnode2);

                if (IsArguments(pnodeBin->pnode1))
                {
                    return true;
                }

                pnode = pnodeBin->pnode2;
                break;
            }

            return false;
        }

        }
    }
}